

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonArrayLengthFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  bool bVar1;
  u32 uVar2;
  u32 uVar3;
  JsonParse *pParse;
  char *zPath;
  char *zPath_00;
  ulong val;
  
  uVar3 = 0;
  pParse = jsonParseFuncArg(ctx,*argv,0);
  if (pParse == (JsonParse *)0x0) {
    return;
  }
  bVar1 = false;
  if (argc == 2) {
    zPath = (char *)sqlite3ValueText(argv[1],'\x01');
    if (zPath == (char *)0x0) {
      jsonParseFree(pParse);
      uVar3 = 0xaaaaaaaa;
      bVar1 = false;
    }
    else {
      zPath_00 = "@";
      if (*zPath == '$') {
        zPath_00 = zPath + 1;
      }
      uVar2 = jsonLookupStep(pParse,0,zPath_00,0);
      if (uVar2 < 0xfffffffd) {
        bVar1 = false;
        uVar3 = uVar2;
      }
      else {
        bVar1 = true;
        uVar3 = 0;
        if (uVar2 != 0xfffffffe) {
          uVar3 = 0;
          if (uVar2 == 0xfffffffd) {
            jsonBadPathError(ctx,zPath);
          }
          else {
            ctx->isError = 1;
            sqlite3VdbeMemSetStr
                      (ctx->pOut,"malformed JSON",-1,'\x01',
                       (_func_void_void_ptr *)0xffffffffffffffff);
          }
        }
      }
    }
    if (zPath == (char *)0x0) {
      return;
    }
  }
  if ((pParse->aBlob[uVar3] & 0xf) == 0xb) {
    uVar3 = jsonbArrayCount(pParse,uVar3);
    val = (ulong)uVar3;
  }
  else {
    val = 0;
  }
  if (!bVar1) {
    pMem = ctx->pOut;
    if ((pMem->flags & 0x9000) == 0) {
      (pMem->u).i = val;
      pMem->flags = 4;
    }
    else {
      vdbeReleaseAndSetInt64(pMem,val);
    }
  }
  jsonParseFree(pParse);
  return;
}

Assistant:

static void jsonArrayLengthFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  sqlite3_int64 cnt = 0;
  u32 i;
  u8 eErr = 0;

  p = jsonParseFuncArg(ctx, argv[0], 0);
  if( p==0 ) return;
  if( argc==2 ){
    const char *zPath = (const char*)sqlite3_value_text(argv[1]);
    if( zPath==0 ){
      jsonParseFree(p);
      return;
    }
    i = jsonLookupStep(p, 0, zPath[0]=='$' ? zPath+1 : "@", 0);
    if( JSON_LOOKUP_ISERROR(i) ){
      if( i==JSON_LOOKUP_NOTFOUND ){
        /* no-op */
      }else if( i==JSON_LOOKUP_PATHERROR ){
        jsonBadPathError(ctx, zPath);
      }else{
        sqlite3_result_error(ctx, "malformed JSON", -1);
      }
      eErr = 1;
      i = 0;
    }
  }else{
    i = 0;
  }
  if( (p->aBlob[i] & 0x0f)==JSONB_ARRAY ){
    cnt = jsonbArrayCount(p, i);
  }
  if( !eErr ) sqlite3_result_int64(ctx, cnt);
  jsonParseFree(p);
}